

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void copy_slot(lua_State *L,TValue *f,int idx)

{
  TValue *pTVar1;
  GCobj *v;
  GCobj *o;
  
  if (idx == -0x2711) {
    o = (GCobj *)(ulong)L->base[-1].u32.lo;
    if ((o->gch).gct != '\b') {
      lj_err_msg(L,LJ_ERR_NOENV);
    }
    v = (GCobj *)(ulong)(f->u32).lo;
    (o->str).hash = (f->u32).lo;
    if (8 < (f->field_2).it + 0xd) {
      return;
    }
    if (((v->gch).marked & 3) == 0) {
      return;
    }
  }
  else {
    if (idx == -0x2712) {
      (L->env).gcptr32 = (uint32_t)(f->field_2).field_0;
      return;
    }
    pTVar1 = index2adr(L,idx);
    *pTVar1 = *f;
    if (-0x2713 < idx) {
      return;
    }
    if (8 < (f->field_2).it + 0xd) {
      return;
    }
    v = (GCobj *)(ulong)(f->u32).lo;
    if (((v->gch).marked & 3) == 0) {
      return;
    }
    o = (GCobj *)(ulong)L->base[-1].u32.lo;
  }
  if (((o->gch).marked & 4) == 0) {
    return;
  }
  lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,o,v);
  return;
}

Assistant:

static void copy_slot(lua_State *L, TValue *f, int idx)
{
  if (idx == LUA_GLOBALSINDEX) {
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    /* NOBARRIER: A thread (i.e. L) is never black. */
    setgcref(L->env, obj2gco(tabV(f)));
  } else if (idx == LUA_ENVIRONINDEX) {
    GCfunc *fn = curr_func(L);
    if (fn->c.gct != ~LJ_TFUNC)
      lj_err_msg(L, LJ_ERR_NOENV);
    lj_checkapi(tvistab(f), "stack slot %d is not a table", idx);
    setgcref(fn->c.env, obj2gco(tabV(f)));
    lj_gc_barrier(L, fn, f);
  } else {
    TValue *o = index2adr_check(L, idx);
    copyTV(L, o, f);
    if (idx < LUA_GLOBALSINDEX)  /* Need a barrier for upvalues. */
      lj_gc_barrier(L, curr_func(L), f);
  }
}